

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O2

void __thiscall leveldb::Table::Rep::~Rep(Rep *this)

{
  Block *this_00;
  
  operator_delete(this->filter);
  if (this->filter_data != (char *)0x0) {
    operator_delete__(this->filter_data);
  }
  this_00 = this->index_block;
  if (this_00 != (Block *)0x0) {
    Block::~Block(this_00);
  }
  operator_delete(this_00);
  Status::~Status(&this->status);
  return;
}

Assistant:

~Rep() {
    delete filter;
    delete[] filter_data;
    delete index_block;
  }